

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::evalSubscriptMat2x3(ShaderEvalContext *c)

{
  VecAccess<float,_4,_3> local_58;
  undefined1 local_40 [12];
  Vector<float,_3> local_34;
  undefined1 local_28 [12];
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_28,(int)c,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_40,(int)local_10,1,2);
  tcu::operator*((tcu *)&local_34,0.5,(Vector<float,_3> *)local_40);
  tcu::operator+((tcu *)&local_1c,(Vector<float,_3> *)local_28,&local_34);
  tcu::Vector<float,_4>::xyz(&local_58,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_58,&local_1c);
  return;
}

Assistant:

void evalSubscriptMat2x3	(ShaderEvalContext& c) { c.color.xyz()	= c.coords.swizzle(0,1,2) + 0.5f*c.coords.swizzle(1,2,3); }